

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O0

void ot::commissioner::ComputeBloomFilter(ByteArray *aOut,ByteArray *aIn)

{
  uint8_t aByte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  size_type sVar4;
  ulong uVar5;
  reference puVar6;
  const_iterator cStack_40;
  uchar byte;
  const_iterator __end2;
  const_iterator __begin2;
  ByteArray *__range2;
  size_t numBits;
  Crc16 ansi;
  Crc16 ccitt;
  ByteArray *aIn_local;
  ByteArray *aOut_local;
  
  _ansi = aIn;
  Crc16::Crc16((Crc16 *)((long)&numBits + 4),kCcitt);
  Crc16::Crc16((Crc16 *)&numBits,kAnsi);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aOut);
  uVar5 = sVar4 << 3;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(aOut);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!aOut.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/bloom_filter.cpp"
                  ,0x37,"void ot::commissioner::ComputeBloomFilter(ByteArray &, const ByteArray &)")
    ;
  }
  bVar2 = std::numeric_limits<unsigned_char>::max();
  this = _ansi;
  if (uVar5 <= bVar2) {
    __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(_ansi);
    cStack_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0);
      if (!bVar1) break;
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&__end2);
      aByte = *puVar6;
      Crc16::Update((Crc16 *)((long)&numBits + 4),aByte);
      Crc16::Update((Crc16 *)&numBits,aByte);
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&__end2);
    }
    uVar3 = Crc16::Get((Crc16 *)((long)&numBits + 4));
    SetBit(aOut,(uint8_t)((ulong)uVar3 % uVar5));
    uVar3 = Crc16::Get((Crc16 *)&numBits);
    SetBit(aOut,(uint8_t)((ulong)uVar3 % uVar5));
    return;
  }
  __assert_fail("numBits <= std::numeric_limits<uint8_t>::max()",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/openthread/bloom_filter.cpp"
                ,0x38,"void ot::commissioner::ComputeBloomFilter(ByteArray &, const ByteArray &)");
}

Assistant:

void ComputeBloomFilter(ByteArray &aOut, const ByteArray &aIn)
{
    Crc16 ccitt(Crc16::Polynomial::kCcitt);
    Crc16 ansi(Crc16::Polynomial::kAnsi);

    const size_t numBits = aOut.size() * 8;

    assert(!aOut.empty());
    assert(numBits <= std::numeric_limits<uint8_t>::max());

    for (auto byte : aIn)
    {
        ccitt.Update(byte);
        ansi.Update(byte);
    }

    SetBit(aOut, ccitt.Get() % numBits);
    SetBit(aOut, ansi.Get() % numBits);
}